

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O0

void __thiscall jpge::jpeg_encoder::code_block(jpeg_encoder *this,int component_num)

{
  int component_num_local;
  jpeg_encoder *this_local;
  
  DCT2D(this->m_sample_array);
  load_quantized_coefficients(this,component_num);
  if (this->m_pass_num == '\x01') {
    code_coefficients_pass_one(this,component_num);
  }
  else {
    code_coefficients_pass_two(this,component_num);
  }
  return;
}

Assistant:

void jpeg_encoder::code_block(int component_num)
{
  DCT2D(m_sample_array);
  load_quantized_coefficients(component_num);
  if (m_pass_num == 1)
    code_coefficients_pass_one(component_num);
  else
    code_coefficients_pass_two(component_num);
}